

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O3

void __thiscall
VW::vw_exception::vw_exception(vw_exception *this,char *pfile,int plineNumber,string *pmessage)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__vw_exception_002d5f58;
  this->file = pfile;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (pmessage->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + pmessage->_M_string_length);
  this->lineNumber = plineNumber;
  return;
}

Assistant:

vw_exception::vw_exception(const char* pfile, int plineNumber, std::string pmessage)
    : file(pfile), message(pmessage), lineNumber(plineNumber)
{
}